

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O2

int stmm_gen(stmm_generator *gen,char **key_p,char **value_p)

{
  long lVar1;
  int iVar2;
  stmm_table_entry *psVar3;
  
  psVar3 = gen->entry;
  if (psVar3 == (stmm_table_entry *)0x0) {
    iVar2 = gen->index;
    lVar1 = (long)iVar2;
    while( true ) {
      iVar2 = iVar2 + 1;
      if (gen->table->num_bins <= lVar1) {
        return 0;
      }
      psVar3 = gen->table->bins[lVar1];
      if (psVar3 != (stmm_table_entry *)0x0) break;
      lVar1 = lVar1 + 1;
    }
    gen->index = iVar2;
    gen->entry = psVar3;
  }
  *key_p = psVar3->key;
  if (value_p != (char **)0x0) {
    *value_p = gen->entry->record;
  }
  gen->entry = gen->entry->next;
  return 1;
}

Assistant:

int
stmm_gen (stmm_generator *gen, char **key_p, char **value_p)
{
    int i;

    if (gen->entry == NULL) {
    /* try to find next entry */
    for (i = gen->index; i < gen->table->num_bins; i++) {
        if (gen->table->bins[i] != NULL) {
        gen->index = i + 1;
        gen->entry = gen->table->bins[i];
        break;
        }
    }
    if (gen->entry == NULL) {
        return 0;       /* that's all folks ! */
    }
    }
    *key_p = gen->entry->key;
    if (value_p != 0) {
    *value_p = gen->entry->record;
    }
    gen->entry = gen->entry->next;
    return 1;
}